

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

bool QtPrivate::intersect_path
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  char cVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  QPainterPath *path;
  long in_FS_OFFSET;
  byte bVar7;
  QPainterPath itemPath;
  QRectF local_158;
  QPainterPath scenePath;
  QPainterPath itemPath_1;
  QTransform local_d8;
  QTransform transform;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _scenePath = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath(&scenePath,(QPainterPath *)intersectData);
  local_158.w._0_4_ = 0xffffffff;
  local_158.w._4_4_ = 0xffffffff;
  local_158.h._0_4_ = 0xffffffff;
  local_158.h._4_4_ = 0xffffffff;
  local_158.xp._0_4_ = 0xffffffff;
  local_158.xp._4_4_ = 0xffffffff;
  local_158.yp._0_4_ = 0xffffffff;
  local_158.yp._4_4_ = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_158,item);
  _q_adjustRect(&local_158);
  pQVar2 = (item->d_ptr).d;
  if ((*(ulong *)&pQVar2->field_0x160 & 0x2000040000) == 0) {
    local_d8.m_matrix[0][2] = -NAN;
    local_d8.m_matrix[1][0] = -NAN;
    local_d8.m_matrix[0][0] = -NAN;
    local_d8.m_matrix[0][1] = -NAN;
    if ((*(ulong *)&pQVar2->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_d8);
    }
    else {
      local_d8.m_matrix[0][0] =
           (pQVar2->sceneTransform).m_matrix[2][0] +
           (double)CONCAT44(local_158.xp._4_4_,local_158.xp._0_4_);
      local_d8.m_matrix[0][1] =
           (pQVar2->sceneTransform).m_matrix[2][1] +
           (double)CONCAT44(local_158.yp._4_4_,local_158.yp._0_4_);
      local_d8.m_matrix[0][2] = (qreal)CONCAT44(local_158.w._4_4_,local_158.w._0_4_);
      local_d8.m_matrix[1][0] = (qreal)CONCAT44(local_158.h._4_4_,local_158.h._0_4_);
    }
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar3 = QPainterPath::contains((QRectF *)&scenePath);
    }
    else {
      cVar3 = QPainterPath::intersects((QRectF *)&scenePath);
    }
    if (cVar3 != '\x01' || IntersectsItemShape < mode) goto LAB_005b6173;
    _itemPath_1 = &DAT_aaaaaaaaaaaaaaaa;
    if ((*(ulong *)&pQVar2->field_0x160 & 0x4000000000000000) == 0) {
      QTransform::inverted((bool *)&transform);
      QTransform::map(&itemPath_1);
    }
    else {
      QPainterPath::translated
                (-(pQVar2->sceneTransform).m_matrix[2][0],-(pQVar2->sceneTransform).m_matrix[2][1]);
    }
    path = &itemPath_1;
    cVar3 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,path,mode);
  }
  else {
    pqVar5 = (qreal *)&DAT_0067a658;
    pQVar6 = &transform;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pQVar6->m_matrix[0][0] = *pqVar5;
      pqVar5 = pqVar5 + (ulong)bVar7 * -2 + 1;
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&transform,item,deviceTransform);
    _itemPath = &DAT_aaaaaaaaaaaaaaaa;
    QTransform::inverted((bool *)&itemPath_1);
    QTransform::operator*(&local_d8,deviceTransform);
    QTransform::map(&itemPath);
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar3 = QPainterPath::contains((QRectF *)&itemPath);
    }
    else {
      cVar3 = QPainterPath::intersects((QRectF *)&itemPath);
    }
    if (cVar3 == '\x01' && mode < ContainsItemBoundingRect) {
      cVar3 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,&itemPath,mode);
    }
    path = &itemPath;
  }
  QPainterPath::~QPainterPath(path);
LAB_005b6173:
  QPainterPath::~QPainterPath(&scenePath);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool intersect_path(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QPainterPath scenePath = *static_cast<const QPainterPath *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QPainterPath itemPath = (deviceTransform * transform.inverted()).map(scenePath);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemPath.contains(brect);
            else
                keep = itemPath.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape))
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = scenePath.contains(itemSceneBoundingRect);
            else
                keep = scenePath.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath = itemd->sceneTransformTranslateOnly
                                      ? scenePath.translated(-itemd->sceneTransform.dx(),
                                                             -itemd->sceneTransform.dy())
                                      : itemd->sceneTransform.inverted().map(scenePath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        }
        return keep;
    }